

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

uint32_t mp_sizeof_int(int64_t num)

{
  uint32_t uVar1;
  
  if (-1 < num) {
    __assert_fail("num < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                  ,0x6c4,"uint32_t mp_sizeof_int(int64_t)");
  }
  if ((ulong)num < 0xffffffffffffffe0) {
    if ((ulong)num < 0xffffffffffffff80) {
      if ((ulong)num < 0xffffffffffff8000) {
        return (uint)((ulong)num < 0xffffffff80000000) * 4 + 5;
      }
      uVar1 = 3;
    }
    else {
      uVar1 = 2;
    }
  }
  else {
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

MP_IMPL uint32_t
mp_sizeof_int(int64_t num)
{
	assert(num < 0);
	if (num >= -0x20) {
		return 1;
	} else if (num >= INT8_MIN && num <= INT8_MAX) {
		return 1 + sizeof(int8_t);
	} else if (num >= INT16_MIN && num <= UINT16_MAX) {
		return 1 + sizeof(int16_t);
	} else if (num >= INT32_MIN && num <= UINT32_MAX) {
		return 1 + sizeof(int32_t);
	} else {
		return 1 + sizeof(int64_t);
	}
}